

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::CallRef::finalize(CallRef *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = (this->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if (((this->operands).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[sVar2]->
          type).id == 1) {
        (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 1;
        break;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  if (this->isReturn == true) {
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 1;
  }
  if ((this->target->type).id == 1) {
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void CallRef::finalize() {
  handleUnreachableOperands(this);
  if (isReturn) {
    type = Type::unreachable;
  }
  if (target->type == Type::unreachable) {
    type = Type::unreachable;
  }
}